

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O3

string * __thiscall
cfd::api::TransactionApi::CreateSignatureHash
          (string *__return_storage_ptr__,TransactionApi *this,string *tx_hex,TxInReference *txin,
          Script *redeem_script,Amount *amount,HashType hash_type,SigHashType *sighash_type)

{
  ByteData local_48;
  
  cfd::core::Script::GetData();
  CreateSignatureHash(__return_storage_ptr__,this,tx_hex,txin,&local_48,amount,hash_type,
                      sighash_type);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const TxInReference& txin,
    const Script& redeem_script, const Amount& amount, HashType hash_type,
    const SigHashType& sighash_type) const {
  return CreateSignatureHash(
      tx_hex, txin, redeem_script.GetData(), amount, hash_type, sighash_type);
}